

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<float>
          (char *expr1,char *expr2,char *absc,float val1,float val2,float abs_v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AssertionResult *pAVar3;
  float *in_RCX;
  AssertionResult *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float diff;
  floating_point<float> f2;
  floating_point<float> f1;
  FInt local_90;
  internal local_8c [4];
  float local_88;
  float local_84;
  char *local_80;
  char *local_78;
  char *local_70;
  _Myt local_68;
  FInt local_64;
  string local_60;
  AssertionResult local_40;
  
  local_90.uv = ~-(uint)(in_XMM1_Da < in_XMM0_Da) & (uint)(in_XMM1_Da - in_XMM0_Da) |
                (uint)(in_XMM0_Da - in_XMM1_Da) & -(uint)(in_XMM1_Da < in_XMM0_Da);
  if ((local_90.fv < in_XMM2_Da) ||
     (local_64.uv = local_90.uv,
     bVar2 = floating_point<float>::AlmostEquals((floating_point<float> *)&local_64,&local_68),
     bVar2)) {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
    return in_RDI;
  }
  paVar1 = &local_40.m_message.field_2;
  local_40.m_message._M_string_length = 0;
  local_40.m_message.field_2._M_local_buf[0] = '\0';
  local_40.m_result = false;
  local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_40,(char (*) [22])"error: Value of: abs(");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_70);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])" - ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_78);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [6])") <= ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_80);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"\n  Actual: abs(");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_84);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])" - ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_88);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])") : ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_90.fv);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\nExpected: ");
  FormatForComparisonFailureMessage<float,float>(&local_60,local_8c,&local_90.fv,in_RCX);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_60);
  (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
  std::__cxx11::string::_M_construct<char*>();
  in_RDI->m_result = pAVar3->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_message._M_dataplus._M_p == paVar1) {
    return in_RDI;
  }
  operator_delete(local_40.m_message._M_dataplus._M_p,
                  CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                           local_40.m_message.field_2._M_local_buf[0]) + 1);
  return in_RDI;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }